

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O1

string * __thiscall
ApprovalTests::CommandReporter::assembleFullCommand
          (string *__return_storage_ptr__,CommandReporter *this,string *received,string *approved)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  pointer pcVar4;
  long lVar5;
  long *plVar6;
  size_type *psVar7;
  long *plVar8;
  ulong *puVar9;
  size_type *psVar10;
  string args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> convertedApproved;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> convertedReceived;
  __string_type __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> convertedCommand;
  ulong *local_130;
  ulong local_128;
  ulong local_120;
  long lStack_118;
  string local_110;
  string local_f0;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  string local_70;
  string local_50;
  
  peVar3 = (this->converter).
           super___shared_ptr<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar3->_vptr_ConvertForCygwin[2])(&local_110,peVar3,&this->cmd);
  plVar6 = (long *)::std::__cxx11::string::insert((ulong)&local_110,0,'\x01');
  paVar1 = &local_f0.field_2;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_f0.field_2._M_allocated_capacity = *psVar7;
    local_f0.field_2._8_8_ = plVar6[3];
    local_f0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar7;
    local_f0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_f0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)::std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_f0,local_f0._M_string_length,0,'\x01');
  local_b0 = &local_a0;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_a0 = *plVar8;
    lStack_98 = plVar6[3];
  }
  else {
    local_a0 = *plVar8;
    local_b0 = (long *)*plVar6;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  paVar2 = &local_110.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  peVar3 = (this->converter).
           super___shared_ptr<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar3->_vptr_ConvertForCygwin[3])(&local_130,peVar3,received);
  plVar6 = (long *)::std::__cxx11::string::insert((ulong)&local_130,0,'\x01');
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_110.field_2._M_allocated_capacity = *psVar7;
    local_110.field_2._8_8_ = plVar6[3];
    local_110._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar7;
    local_110._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_110._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)::std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_110,local_110._M_string_length,0,'\x01');
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_f0.field_2._M_allocated_capacity = *psVar7;
    local_f0.field_2._8_8_ = plVar6[3];
    local_f0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar7;
    local_f0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_f0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  peVar3 = (this->converter).
           super___shared_ptr<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar3->_vptr_ConvertForCygwin[3])(&local_d0,peVar3,approved);
  plVar6 = (long *)::std::__cxx11::string::insert((ulong)&local_d0,0,'\x01');
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_120 = *puVar9;
    lStack_118 = plVar6[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar9;
    local_130 = (ulong *)*plVar6;
  }
  local_128 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)::std::__cxx11::string::_M_replace_aux((ulong)&local_130,local_128,0,'\x01');
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_110.field_2._M_allocated_capacity = *psVar7;
    local_110.field_2._8_8_ = plVar6[3];
    local_110._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar7;
    local_110._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_110._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  paVar1 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_128 = 0;
  local_120 = local_120 & 0xffffffffffffff00;
  pcVar4 = (this->arguments)._M_dataplus._M_p;
  local_130 = &local_120;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar4,pcVar4 + (this->arguments)._M_string_length);
  DiffInfo::receivedFileTemplate_abi_cxx11_();
  StringUtils::replaceAll(&local_d0,&local_50,&local_90,&local_f0);
  ::std::__cxx11::string::operator=((string *)&local_130,(string *)&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_130,local_128 + (long)local_130);
  DiffInfo::approvedFileTemplate_abi_cxx11_();
  StringUtils::replaceAll(&local_d0,&local_70,&local_90,&local_110);
  ::std::__cxx11::string::operator=((string *)&local_130,(string *)&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_b0,local_a8 + (long)local_b0);
  ::std::__cxx11::string::_M_replace_aux((ulong)&local_d0,local_d0._M_string_length,0,'\x01');
  plVar6 = (long *)::std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_130);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar10 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar10) {
    lVar5 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommandReporter::assembleFullCommand(const std::string& received,
                                                     const std::string& approved) const
    {
        auto convertedCommand = '"' + converter->convertProgramForCygwin(cmd) + '"';
        auto convertedReceived =
            '"' + converter->convertFileArgumentForCygwin(received) + '"';
        auto convertedApproved =
            '"' + converter->convertFileArgumentForCygwin(approved) + '"';

        std::string args;
        args = StringUtils::replaceAll(
            arguments, DiffInfo::receivedFileTemplate(), convertedReceived);
        args = StringUtils::replaceAll(
            args, DiffInfo::approvedFileTemplate(), convertedApproved);

        return convertedCommand + ' ' + args;
    }